

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::AsyncStreamFd::splicePumpLoop
          (AsyncStreamFd *this,AsyncStreamFd *input,int pipeIn,int pipeOut,uint64_t readSoFar,
          uint64_t limit,size_t bufferedAmount)

{
  PromiseArena *pPVar1;
  size_t sVar2;
  PromiseBase PVar3;
  undefined1 auVar4 [8];
  Disposer DVar5;
  OwnPromiseNode OVar6;
  PromiseRejector PVar7;
  uint uVar8;
  void *pvVar9;
  undefined4 in_register_00000014;
  _func_int **pp_Var10;
  undefined1 unaff_RBX [8];
  anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 __fdout;
  size_t __len;
  FdObserver *this_00;
  int iVar11;
  TransformPromiseNodeBase *pTVar12;
  bool bVar13;
  PromiseRejector in_stack_00000010;
  Fault f;
  ssize_t n;
  OwnPromiseNode intermediate;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  Exception *local_d0;
  Fault local_c8;
  PromiseBase local_c0;
  int local_b4;
  undefined1 local_b0 [8];
  undefined1 local_a8 [8];
  Disposer local_a0;
  AsyncStreamFd *local_98;
  OwnPromiseNode local_90;
  DebugComparison<unsigned_long_&,_unsigned_long_&> local_88;
  Disposer *local_58;
  Disposer *local_50;
  PromiseArenaMember *local_48;
  PromiseArenaMember *local_40;
  FdObserver *local_38;
  
  pp_Var10 = (_func_int **)CONCAT44(in_register_00000014,pipeIn);
  local_38 = &input->observer;
  local_d0 = (Exception *)
             (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
             _vptr_AsyncInputStream;
  local_c0.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  local_b4 = pipeOut;
  local_a0._vptr_Disposer = (_func_int **)limit;
  local_98 = input;
LAB_004b6a53:
  while( true ) {
    this_00 = (FdObserver *)local_a8;
    __fdout = SUB84(readSoFar,0);
    if ((PromiseArenaMember *)in_stack_00000010._vptr_PromiseRejector == (PromiseArenaMember *)0x0)
    break;
    do {
      iVar11 = 0;
      local_b0 = (undefined1  [8])
                 splice(local_b4,(__off64_t *)0x0,(local_98->super_OwnedFileDescriptor).fd,
                        (__off64_t *)0x0,0x100000,3);
      if (-1 < (long)local_b0) break;
      uVar8 = kj::_::Debug::getOsErrorNumber(true);
      unaff_RBX = (undefined1  [8])((ulong)unaff_RBX & 0xffffffff);
      if (uVar8 != 0xffffffff) {
        unaff_RBX = (undefined1  [8])(ulong)uVar8;
      }
      iVar11 = SUB84(unaff_RBX,0);
    } while (uVar8 == 0xffffffff);
    if (iVar11 != 0) {
      ((PromiseArenaMember *)local_c0.node.ptr)->_vptr_PromiseArenaMember = (_func_int **)local_d0;
      local_c8.exception = (Exception *)0x0;
      local_88.left = (unsigned_long *)0x0;
      local_88.right = (unsigned_long *)0x0;
      kj::_::Debug::Fault::init
                (&local_c8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_c8);
    }
    if ((long)local_b0 < 1) {
      local_88.left = (unsigned_long *)local_b0;
      local_88.right = (unsigned_long *)((ulong)local_88.right & 0xffffffff00000000);
      local_88.op.content.ptr = " < ";
      local_88.op.content.size_ = (size_t)&DAT_00000004;
      local_88.result = (bool)(local_b0[7] >> 7);
      if (-1 < (long)local_b0) {
        ((PromiseArenaMember *)local_c0.node.ptr)->_vptr_PromiseArenaMember = (_func_int **)local_d0
        ;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[49],unsigned_long&>
                  (&local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x1b5,FAILED,"n < 0",
                   "_kjCondition,\"splice pipe empty before bufferedAmount reached?\", bufferedAmount"
                   ,(DebugComparison<long_&,_int> *)&local_88,
                   (char (*) [49])"splice pipe empty before bufferedAmount reached?",
                   (unsigned_long *)&stack0x00000010);
        kj::_::Debug::Fault::fatal(&local_c8);
      }
      local_40 = (PromiseArenaMember *)local_b0;
      UnixEventPort::FdObserver::whenBecomesWritable(this_00);
      auVar4 = local_a8;
      local_58 = (Disposer *)local_a0._vptr_Disposer;
      local_50 = (Disposer *)bufferedAmount;
      local_48 = (PromiseArenaMember *)in_stack_00000010._vptr_PromiseRejector;
      pPVar1 = (PromiseArena *)((SleepHooks *)((long)local_a8 + 8))->_vptr_SleepHooks;
      if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_a8 - (long)pPVar1) < 0x50) {
        pvVar9 = operator_new(0x400);
        pTVar12 = (TransformPromiseNodeBase *)((long)pvVar9 + 0x3b0);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar12,(OwnPromiseNode *)this_00,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:439:21)>
                   ::anon_class_48_7_4778365b_for_func::operator());
        *(undefined ***)((long)pvVar9 + 0x3b0) = &PTR_destroy_0070dfb8;
        *(AsyncStreamFd **)((long)pvVar9 + 0x3d0) = local_98;
        *(_func_int ***)((long)pvVar9 + 0x3d8) = pp_Var10;
        *(int *)((long)pvVar9 + 0x3e0) = local_b4;
        *(anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 *)((long)pvVar9 + 0x3e4) = __fdout;
        *(Disposer **)((long)pvVar9 + 1000) = local_58;
        *(Disposer **)((long)pvVar9 + 0x3f0) = local_50;
        *(PromiseArenaMember **)((long)pvVar9 + 0x3f8) = local_48;
        *(void **)((long)pvVar9 + 0x3b8) = pvVar9;
      }
      else {
        ((SleepHooks *)((long)local_a8 + 8))->_vptr_SleepHooks = (_func_int **)0x0;
        pTVar12 = (TransformPromiseNodeBase *)
                  ((((UnixEventPort *)((long)local_a8 + -0xf8))->originalMask).__val + 0xb);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar12,(OwnPromiseNode *)this_00,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:439:21)>
                   ::anon_class_48_7_4778365b_for_func::operator());
        (((UnixEventPort *)((long)auVar4 + -0xf8))->originalMask).__val[0xb] =
             (unsigned_long)&PTR_destroy_0070dfb8;
        (((UnixEventPort *)((long)auVar4 + -0xf8))->originalMask).__val[0xf] =
             (unsigned_long)local_98;
        *(_func_int ***)&((UnixEventPort *)((long)auVar4 + -0xf8))->epollFd = pp_Var10;
        *(int *)&(((UnixEventPort *)((long)auVar4 + -0xf8))->timerFd).ptr = local_b4;
        (((UnixEventPort *)((long)auVar4 + -0xf8))->timerFd).ptr.field_1 = __fdout;
        *(Disposer **)&((UnixEventPort *)((long)auVar4 + -0xf8))->sleeping = local_58;
        (((UnixEventPort *)((long)auVar4 + -0xf8))->childSet).ptr.disposer = local_50;
        (((UnixEventPort *)((long)auVar4 + -0xf8))->childSet).ptr.ptr = (ChildSet *)local_48;
        (((UnixEventPort *)((long)auVar4 + -0xf8))->originalMask).__val[0xc] = (unsigned_long)pPVar1
        ;
      }
      local_88.left = &DAT_005053bd;
      local_88.right = (unsigned_long *)&DAT_0050541c;
      local_88.op.content.ptr = (char *)0x4c0000058b;
      local_90.ptr = &pTVar12->super_PromiseNode;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                ((PromiseDisposer *)&local_c8,&local_90,(SourceLocation *)&local_88);
      OVar6.ptr = local_90.ptr;
      local_d0 = local_c8.exception;
      if ((TransformPromiseNodeBase *)local_90.ptr != (TransformPromiseNodeBase *)0x0) {
        local_90.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar6.ptr)->super_PromiseArenaMember);
      }
      unaff_RBX = (undefined1  [8])local_40;
      auVar4 = local_a8;
      PVar7._vptr_PromiseRejector = in_stack_00000010._vptr_PromiseRejector;
      if (local_a8 != (undefined1  [8])0x0) {
        local_a8 = (undefined1  [8])0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar4);
        PVar7._vptr_PromiseRejector = in_stack_00000010._vptr_PromiseRejector;
      }
    }
    else {
      local_88.left = (unsigned_long *)local_b0;
      local_88.right = (unsigned_long *)&stack0x00000010;
      local_88.op.content.ptr = " <= ";
      local_88.op.content.size_ = (size_t)&DAT_00000005;
      local_88.result = in_stack_00000010._vptr_PromiseRejector >= (ulong)local_b0;
      unaff_RBX = local_b0;
      PVar7._vptr_PromiseRejector =
           (_func_int **)((long)in_stack_00000010._vptr_PromiseRejector - (long)local_b0);
      if (in_stack_00000010._vptr_PromiseRejector < (ulong)local_b0) {
        ((PromiseArenaMember *)local_c0.node.ptr)->_vptr_PromiseArenaMember = (_func_int **)local_d0
        ;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<long&,unsigned_long&>&,char_const(&)[40]>
                  (&local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x1b2,FAILED,"n <= bufferedAmount",
                   "_kjCondition,\"splice pipe larger than bufferedAmount?\"",
                   (DebugComparison<long_&,_unsigned_long_&> *)&local_88,
                   (char (*) [40])"splice pipe larger than bufferedAmount?");
        kj::_::Debug::Fault::fatal(&local_c8);
      }
    }
    in_stack_00000010._vptr_PromiseRejector = PVar7._vptr_PromiseRejector;
    if ((long)unaff_RBX < 1) {
LAB_004b6e82:
      *(Exception **)local_c0.node.ptr = local_d0;
      return (Promise<unsigned_long>)(PromiseNode *)local_c0.node.ptr;
    }
  }
  bVar13 = local_a0._vptr_Disposer == (_func_int **)bufferedAmount;
  if (local_a0._vptr_Disposer < bufferedAmount) {
    do {
      __len = bufferedAmount - (long)local_a0._vptr_Disposer;
      if (0xfffff < __len) {
        __len = 0x100000;
      }
      iVar11 = 0;
      unaff_RBX = (undefined1  [8])
                  splice(*(int *)(pp_Var10 + 2),(__off64_t *)0x0,(int)__fdout,(__off64_t *)0x0,__len
                         ,3);
      if (-1 < (long)unaff_RBX) break;
      uVar8 = kj::_::Debug::getOsErrorNumber(true);
      this_00 = (FdObserver *)((ulong)this_00 & 0xffffffff);
      if (uVar8 != 0xffffffff) {
        this_00 = (FdObserver *)(ulong)uVar8;
      }
      iVar11 = (int)this_00;
    } while (uVar8 == 0xffffffff);
    if (iVar11 != 0) {
      ((PromiseArenaMember *)local_c0.node.ptr)->_vptr_PromiseArenaMember = (_func_int **)local_d0;
      local_c8.exception = (Exception *)0x0;
      local_88.left = (unsigned_long *)0x0;
      local_88.right = (unsigned_long *)0x0;
      kj::_::Debug::Fault::init
                (&local_c8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_c8);
    }
    if (unaff_RBX != (undefined1  [8])0x0) {
      if ((long)unaff_RBX < 0) {
        ((PromiseArenaMember *)local_c0.node.ptr)->_vptr_PromiseArenaMember = (_func_int **)local_d0
        ;
        UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_b0);
        DVar5._vptr_Disposer = local_a0._vptr_Disposer;
        auVar4 = local_b0;
        sVar2 = bufferedAmount;
        pPVar1 = *(PromiseArena **)((long)local_b0 + 8);
        if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_b0 - (long)pPVar1) < 0x48) {
          pvVar9 = operator_new(0x400);
          pTVar12 = (TransformPromiseNodeBase *)((long)pvVar9 + 0x3b8);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar12,(OwnPromiseNode *)local_b0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:462:21)>
                     ::anon_class_40_6_95052f75_for_func::operator());
          *(undefined ***)((long)pvVar9 + 0x3b8) = &PTR_destroy_0070e010;
          *(AsyncStreamFd **)((long)pvVar9 + 0x3d8) = local_98;
          *(_func_int ***)((long)pvVar9 + 0x3e0) = pp_Var10;
          *(int *)((long)pvVar9 + 1000) = local_b4;
          *(anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 *)((long)pvVar9 + 0x3ec) =
               __fdout;
          *(_func_int ***)((long)pvVar9 + 0x3f0) = DVar5._vptr_Disposer;
          *(size_t *)((long)pvVar9 + 0x3f8) = sVar2;
          *(void **)((long)pvVar9 + 0x3c0) = pvVar9;
        }
        else {
          *(PromiseArena **)((long)local_b0 + 8) = (PromiseArena *)0x0;
          pTVar12 = (TransformPromiseNodeBase *)((long)local_b0 + -0x48);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar12,(OwnPromiseNode *)local_b0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:462:21)>
                     ::anon_class_40_6_95052f75_for_func::operator());
          *(undefined ***)((long)auVar4 + -0x48) = &PTR_destroy_0070e010;
          *(AsyncStreamFd **)((long)auVar4 + -0x28) = local_98;
          ((PromiseArenaMember *)((long)auVar4 + -0x20))->_vptr_PromiseArenaMember = pp_Var10;
          *(int *)((long)auVar4 + -0x18) = local_b4;
          *(anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 *)((long)auVar4 - 0x14) = __fdout
          ;
          ((PromiseArenaMember *)((long)auVar4 + -0x10))->_vptr_PromiseArenaMember =
               DVar5._vptr_Disposer;
          *(size_t *)((long)auVar4 + -8) = sVar2;
          ((PromiseArenaMember *)((long)auVar4 + -0x40))->_vptr_PromiseArenaMember =
               (_func_int **)pPVar1;
        }
        local_88.left = &DAT_005053bd;
        local_88.right = (unsigned_long *)&DAT_0050541c;
        local_88.op.content.ptr = (char *)0x4c0000058b;
        local_90.ptr = &pTVar12->super_PromiseNode;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_c8,&local_90,(SourceLocation *)&local_88);
        OVar6.ptr = local_90.ptr;
        PVar3.node.ptr = local_c0.node.ptr;
        *(Exception **)local_c0.node.ptr = local_c8.exception;
        if ((TransformPromiseNodeBase *)local_90.ptr != (TransformPromiseNodeBase *)0x0) {
          local_90.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(OVar6.ptr)->super_PromiseArenaMember);
        }
        auVar4 = local_b0;
        if (local_b0 == (undefined1  [8])0x0) {
          return (Promise<unsigned_long>)(PromiseNode *)PVar3.node.ptr;
        }
        local_b0 = (undefined1  [8])0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar4);
        return (Promise<unsigned_long>)(PromiseNode *)PVar3.node.ptr;
      }
      local_a0._vptr_Disposer = local_a0._vptr_Disposer + (long)unaff_RBX;
      in_stack_00000010._vptr_PromiseRejector = (_func_int **)unaff_RBX;
      goto LAB_004b6a53;
    }
    ((PromiseArenaMember *)local_c0.node.ptr)->_vptr_PromiseArenaMember = (_func_int **)local_d0;
  }
  else {
    ((PromiseArenaMember *)local_c0.node.ptr)->_vptr_PromiseArenaMember = (_func_int **)local_d0;
    local_88.left = (unsigned_long *)&local_a0;
    local_88.right = &bufferedAmount;
    local_88.op.content.ptr = " == ";
    local_88.op.content.size_ = (size_t)&DAT_00000005;
    local_88.result = bVar13;
    if (!bVar13) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
                (&local_c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x1c1,FAILED,"readSoFar == limit","_kjCondition,",&local_88);
      kj::_::Debug::Fault::fatal(&local_c8);
    }
  }
  PVar3.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_c0;
  local_88.left = (unsigned_long *)local_a0._vptr_Disposer;
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
            ((PromiseDisposer *)&local_c8,(unsigned_long *)&local_88);
  local_d0 = local_c8.exception;
  local_c0.node.ptr = (OwnPromiseNode)(OwnPromiseNode)PVar3;
  goto LAB_004b6e82;
}

Assistant:

Promise<uint64_t> splicePumpLoop(AsyncStreamFd& input, int pipeIn, int pipeOut,
                                   uint64_t readSoFar, uint64_t limit, size_t bufferedAmount) {
    for (;;) {
      while (bufferedAmount > 0) {
        // First flush out whatever is in the pipe buffer.
        ssize_t n;
        KJ_NONBLOCKING_SYSCALL(n = splice(pipeIn, nullptr, fd, nullptr,
            MAX_SPLICE_LEN, SPLICE_F_MOVE | SPLICE_F_NONBLOCK));
        if (n > 0) {
          KJ_ASSERT(n <= bufferedAmount, "splice pipe larger than bufferedAmount?");
          bufferedAmount -= n;
        } else {
          KJ_ASSERT(n < 0, "splice pipe empty before bufferedAmount reached?", bufferedAmount);
          return observer.whenBecomesWritable()
              .then([this, &input, pipeIn, pipeOut, readSoFar, limit, bufferedAmount]() {
            return splicePumpLoop(input, pipeIn, pipeOut, readSoFar, limit, bufferedAmount);
          });
        }
      }

      // Now the pipe buffer is empty, so we can try to read some more.
      {
        if (readSoFar >= limit) {
          // Hit the limit, we're done.
          KJ_ASSERT(readSoFar == limit);
          return readSoFar;
        }

        ssize_t n;
        KJ_NONBLOCKING_SYSCALL(n = splice(input.fd, nullptr, pipeOut, nullptr,
            kj::min(limit - readSoFar, MAX_SPLICE_LEN), SPLICE_F_MOVE | SPLICE_F_NONBLOCK));
        if (n == 0) {
          // EOF.
          return readSoFar;
        } else if (n < 0) {
          // No data available, wait.
          return input.observer.whenBecomesReadable()
              .then([this, &input, pipeIn, pipeOut, readSoFar, limit]() {
            return splicePumpLoop(input, pipeIn, pipeOut, readSoFar, limit, 0);
          });
        }

        readSoFar += n;
        bufferedAmount = n;
      }
    }
  }